

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-send-immediate.c
# Opt level: O3

void alloc_cb(uv_handle_t *handle,size_t suggested_size,uv_buf_t *buf)

{
  int iVar1;
  long lVar2;
  undefined8 *extraout_RDX;
  
  lVar2 = CONCAT71(0x5a94,(uv_udp_t *)handle == &client || (uv_udp_t *)handle == &server);
  if ((uv_udp_t *)handle == &client || (uv_udp_t *)handle == &server) {
    if (suggested_size < 0x10001) {
      buf->base = alloc_cb::slab;
      buf->len = 0x10000;
      return;
    }
  }
  else {
    alloc_cb_cold_1();
  }
  alloc_cb_cold_2();
  if ((long)suggested_size < 1) {
    sv_recv_cb_cold_1();
LAB_0017cdef:
    sv_recv_cb_cold_2();
  }
  else {
    if (suggested_size != 4) goto LAB_0017cdef;
    if (lVar2 != 0) {
      if (*(int *)*extraout_RDX == 0x54495845) {
        uv_close();
        uv_close(&client,close_cb);
        sv_recv_cb_called = sv_recv_cb_called + 1;
        return;
      }
      goto LAB_0017cdf9;
    }
  }
  sv_recv_cb_cold_4();
LAB_0017cdf9:
  sv_recv_cb_cold_3();
  if ((uv_udp_t *)handle == &client || (uv_udp_t *)handle == &server) {
    iVar1 = uv_is_closing();
    if (iVar1 != 0) {
      close_cb_called = close_cb_called + 1;
      return;
    }
  }
  else {
    close_cb_cold_1();
  }
  close_cb_cold_2();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return;
  }
  uv_close(handle,0);
  return;
}

Assistant:

static void alloc_cb(uv_handle_t* handle,
                     size_t suggested_size,
                     uv_buf_t* buf) {
  static char slab[65536];
  CHECK_HANDLE(handle);
  ASSERT(suggested_size <= sizeof(slab));
  buf->base = slab;
  buf->len = sizeof(slab);
}